

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ObjCollectMulti_rec(Aig_Obj_t *pRoot,Aig_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  void **ppvVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  do {
    if (pObj != pRoot) {
      if (((ulong)pObj & 1) != 0) {
LAB_0050e145:
        uVar4 = 0;
        uVar3 = (ulong)(uint)vSuper->nSize;
        if (vSuper->nSize < 1) {
          uVar3 = uVar4;
        }
        do {
          if (uVar3 == uVar4) {
            Vec_PtrPush(vSuper,pObj);
            return;
          }
          ppvVar1 = vSuper->pArray + uVar4;
          uVar4 = uVar4 + 1;
        } while ((Aig_Obj_t *)*ppvVar1 != pObj);
        return;
      }
      uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
      if (((uVar2 & 7) == 2) || (((uVar2 ^ *(uint *)&pRoot->field_0x18) & 7) != 0))
      goto LAB_0050e145;
    }
    Aig_ObjCollectMulti_rec(pRoot,pObj->pFanin0,vSuper);
    pObj = pObj->pFanin1;
  } while( true );
}

Assistant:

void Aig_ObjCollectMulti_rec( Aig_Obj_t * pRoot, Aig_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pRoot != pObj && (Aig_IsComplement(pObj) || Aig_ObjIsCi(pObj) || Aig_ObjType(pRoot) != Aig_ObjType(pObj)) )
    {
        Vec_PtrPushUnique(vSuper, pObj);
        return;
    }
    Aig_ObjCollectMulti_rec( pRoot, Aig_ObjChild0(pObj), vSuper );
    Aig_ObjCollectMulti_rec( pRoot, Aig_ObjChild1(pObj), vSuper );
}